

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O1

void do_cmd_autopickup(command *cmd)

{
  uint32_t *puVar1;
  ushort uVar2;
  wchar_t wVar3;
  
  wVar3 = do_autopickup(player);
  uVar2 = z_info->move_energy;
  wVar3 = (wVar3 * (uint)uVar2) / 10;
  if ((int)(uint)uVar2 <= wVar3) {
    wVar3 = (uint)uVar2;
  }
  player->upkeep->energy_use = wVar3;
  event_signal(EVENT_SEEFLOOR);
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x800000;
  return;
}

Assistant:

void do_cmd_autopickup(struct command *cmd)
{
	/* Get the obvious things */
	player->upkeep->energy_use = do_autopickup(player)
		* z_info->move_energy / 10;
	if (player->upkeep->energy_use > z_info->move_energy)
		player->upkeep->energy_use = z_info->move_energy;

	/* Look at or feel what's left */
	event_signal(EVENT_SEEFLOOR);

	/* Redraw the object list using the upkeep flag so that the update can be
	 * somewhat coalesced. Use event_signal(EVENT_ITEMLIST to force update. */
	player->upkeep->redraw |= (PR_ITEMLIST);
}